

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

bool __thiscall
chrono::ChEnumMapper<myEnum>::SetValueAsString(ChEnumMapper<myEnum> *this,string *mname)

{
  __type _Var1;
  byte bVar2;
  ulong uVar3;
  element_type *peVar4;
  size_type sVar5;
  reference pvVar6;
  istringstream local_1a8 [8];
  istringstream mstream;
  uint local_28;
  int local_24;
  int numb;
  int i;
  string *mname_local;
  ChEnumMapper<myEnum> *this_local;
  
  local_24 = 0;
  _numb = mname;
  mname_local = (string *)this;
  do {
    uVar3 = (ulong)local_24;
    peVar4 = std::
             __shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->enummap);
    sVar5 = std::
            vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>
            ::size(peVar4);
    if (sVar5 <= uVar3) {
      std::__cxx11::istringstream::istringstream(local_1a8,(string *)_numb,_S_in);
      std::istream::operator>>((istream *)local_1a8,(int *)&local_28);
      bVar2 = std::ios::fail();
      this_local._7_1_ = (bVar2 & 1) == 0;
      if ((bool)this_local._7_1_) {
        (*(this->super_ChEnumMapperBase)._vptr_ChEnumMapperBase[1])(this,(ulong)local_28);
      }
      std::__cxx11::istringstream::~istringstream(local_1a8);
LAB_0014b186:
      return (bool)(this_local._7_1_ & 1);
    }
    peVar4 = std::
             __shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->enummap);
    pvVar6 = std::
             vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>
             ::at(peVar4,(long)local_24);
    _Var1 = std::operator==(&pvVar6->name,_numb);
    if (_Var1) {
      peVar4 = std::
               __shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->enummap);
      pvVar6 = std::
               vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>
               ::at(peVar4,(long)local_24);
      *this->value_ptr = pvVar6->enumid;
      this_local._7_1_ = 1;
      goto LAB_0014b186;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

virtual bool SetValueAsString(const std::string& mname) override {
        for (int i = 0; i < enummap->size(); ++i) {
            if (enummap->at(i).name == mname) {
                *value_ptr = enummap->at(i).enumid;
                return true;
            }
        }
        // try to find from integer:
        int numb;
        std::istringstream mstream(mname);
        mstream >> numb;
        if (mstream.fail())
            return false;

        // Set value from number
        SetValueAsInt(numb);
        return true;
    }